

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall
soul::StructuralParser::parseArrayTypeSuffixes
          (StructuralParser *this,Expression *t,ParseTypeContext parseContext)

{
  char *pcVar1;
  bool bVar2;
  TypeMetaFunction *pTVar3;
  CompileMessage local_58;
  
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a495b);
  if (bVar2) {
    do {
      t = parseSubscriptWithBrackets(this,t);
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a495b);
    } while (bVar2);
  }
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if (pcVar1 != "&") {
    if (pcVar1 == (char *)0x0) {
      return t;
    }
    if ((*pcVar1 != '&') || (pcVar1[1] != '\0')) goto switchD_001f4063_caseD_1;
  }
  switch(parseContext) {
  case variableType:
    CompileMessageHelpers::createMessage<>(&local_58,syntax,error,"This type cannot be a reference")
    ;
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
    break;
  case nameOrType:
  case metaFunctionArgument:
    goto switchD_001f4063_caseD_1;
  default:
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    local_58.description._M_dataplus._M_p._0_4_ = 3;
    pTVar3 = PoolAllocator::
             allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op>
                       (&this->allocator->pool,&(t->super_Statement).super_ASTObject.context,t,
                        (Op *)&local_58);
    return &pTVar3->super_Expression;
  case eventType:
    CompileMessageHelpers::createMessage<>
              (&local_58,syntax,error,"Event types cannot be references");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
    break;
  case structMember:
    CompileMessageHelpers::createMessage<>
              (&local_58,syntax,error,"Struct members cannot be references");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
    break;
  case usingDeclTarget:
    CompileMessageHelpers::createMessage<>
              (&local_58,syntax,error,"Using declarations cannot be references");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
    break;
  case processorParameter:
    CompileMessageHelpers::createMessage<>
              (&local_58,syntax,error,"Processor parameter types cannot be references");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_58.description._M_dataplus._M_p._4_4_,
                  local_58.description._M_dataplus._M_p._0_4_) != &local_58.description.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_58.description._M_dataplus._M_p._4_4_,
                             local_58.description._M_dataplus._M_p._0_4_),
                    local_58.description.field_2._M_allocated_capacity + 1);
  }
switchD_001f4063_caseD_1:
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == ".") || (((pcVar1 != (char *)0x0 && (*pcVar1 == '.')) && (pcVar1[1] == '\0')))) {
    t = parseDotOperator(this,t);
  }
  return t;
}

Assistant:

AST::Expression& parseArrayTypeSuffixes (AST::Expression& t, ParseTypeContext parseContext)
    {
        if (matchIf (Operator::openBracket))
            return parseArrayTypeSuffixes (parseSubscriptWithBrackets (t), parseContext);

        if (matches (Operator::bitwiseAnd))
        {
            switch (parseContext)
            {
                case ParseTypeContext::variableType:         throwError (Errors::typeCannotBeReference()); break;
                case ParseTypeContext::eventType:            throwError (Errors::eventTypeCannotBeReference()); break;
                case ParseTypeContext::structMember:         throwError (Errors::memberCannotBeReference()); break;
                case ParseTypeContext::usingDeclTarget:      throwError (Errors::usingCannotBeReference()); break;
                case ParseTypeContext::processorParameter:   throwError (Errors::processorParamsCannotBeReference()); break;
                case ParseTypeContext::metaFunctionArgument: break;
                case ParseTypeContext::nameOrType:           break;

                default:
                    skip();
                    return allocate<AST::TypeMetaFunction> (t.context, t, AST::TypeMetaFunction::Op::makeReference);
            }
        }

        if (matches (Operator::dot))
            return parseDotOperator (t);

        return t;
    }